

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VmaAllocation_T * __thiscall
VmaPoolAllocator<VmaAllocation_T>::Alloc<bool_const&>
          (VmaPoolAllocator<VmaAllocation_T> *this,bool *args)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  Item *in_RAX;
  ItemBlock *pIVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  sVar4 = (this->m_ItemBlocks).m_Count;
  lVar7 = sVar4 + 1;
  lVar8 = sVar4 * 0x10 + -4;
  do {
    lVar7 = lVar7 + -1;
    if (lVar7 == 0) break;
    pIVar6 = (this->m_ItemBlocks).m_pArray;
    uVar3 = *(uint *)((long)&pIVar6->pItems + lVar8);
    if ((ulong)uVar3 != 0xffffffff) {
      lVar5 = *(long *)((long)pIVar6 + lVar8 + -0xc);
      lVar9 = (ulong)uVar3 * 0x58;
      in_RAX = (Item *)(lVar5 + lVar9);
      *(undefined4 *)((long)&pIVar6->pItems + lVar8) = *(undefined4 *)(lVar5 + lVar9);
      bVar2 = *args;
      *(undefined8 *)(lVar5 + 0x28 + lVar9) = 1;
      puVar1 = (undefined8 *)(lVar5 + 0x3d + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar5 + 0x30 + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined2 *)(lVar5 + 0x4d + lVar9) = 1;
      *(char *)(lVar5 + 0x4f + lVar9) = bVar2 * '\x02';
      *(undefined4 *)(lVar5 + 0x50 + lVar9) = 0;
    }
    lVar8 = lVar8 + -0x10;
  } while (uVar3 == 0xffffffff);
  if (lVar7 == 0) {
    pIVar6 = CreateNewBlock(this);
    in_RAX = pIVar6->pItems;
    pIVar6->FirstFreeIndex = in_RAX->NextFreeIndex;
    bVar2 = *args;
    *(char *)((long)in_RAX + 0x28) = '\x01';
    *(char *)((long)in_RAX + 0x29) = '\0';
    *(char *)((long)in_RAX + 0x2a) = '\0';
    *(char *)((long)in_RAX + 0x2b) = '\0';
    *(char *)((long)in_RAX + 0x2c) = '\0';
    *(char *)((long)in_RAX + 0x2d) = '\0';
    *(char *)((long)in_RAX + 0x2e) = '\0';
    *(char *)((long)in_RAX + 0x2f) = '\0';
    *(char *)((long)in_RAX + 0x3d) = '\0';
    *(char *)((long)in_RAX + 0x3e) = '\0';
    *(char *)((long)in_RAX + 0x3f) = '\0';
    *(char *)((long)in_RAX + 0x40) = '\0';
    *(char *)((long)in_RAX + 0x41) = '\0';
    *(char *)((long)in_RAX + 0x42) = '\0';
    *(char *)((long)in_RAX + 0x43) = '\0';
    *(char *)((long)in_RAX + 0x44) = '\0';
    *(char *)((long)in_RAX + 0x45) = '\0';
    *(char *)((long)in_RAX + 0x46) = '\0';
    *(char *)((long)in_RAX + 0x47) = '\0';
    *(char *)((long)in_RAX + 0x48) = '\0';
    *(char *)((long)in_RAX + 0x49) = '\0';
    *(char *)((long)in_RAX + 0x4a) = '\0';
    *(char *)((long)in_RAX + 0x4b) = '\0';
    *(char *)((long)in_RAX + 0x4c) = '\0';
    *(char *)((long)in_RAX + 0x30) = '\0';
    *(char *)((long)in_RAX + 0x31) = '\0';
    *(char *)((long)in_RAX + 0x32) = '\0';
    *(char *)((long)in_RAX + 0x33) = '\0';
    *(char *)((long)in_RAX + 0x34) = '\0';
    *(char *)((long)in_RAX + 0x35) = '\0';
    *(char *)((long)in_RAX + 0x36) = '\0';
    *(char *)((long)in_RAX + 0x37) = '\0';
    *(char *)((long)in_RAX + 0x38) = '\0';
    *(char *)((long)in_RAX + 0x39) = '\0';
    *(char *)((long)in_RAX + 0x3a) = '\0';
    *(char *)((long)in_RAX + 0x3b) = '\0';
    *(char *)((long)in_RAX + 0x3c) = '\0';
    *(char *)((long)in_RAX + 0x3d) = '\0';
    *(char *)((long)in_RAX + 0x3e) = '\0';
    *(char *)((long)in_RAX + 0x3f) = '\0';
    *(char *)((long)in_RAX + 0x4d) = '\x01';
    *(char *)((long)in_RAX + 0x4e) = '\0';
    in_RAX->Value[0x4f] = bVar2 * '\x02';
    *(char *)((long)in_RAX + 0x50) = '\0';
    *(char *)((long)in_RAX + 0x51) = '\0';
    *(char *)((long)in_RAX + 0x52) = '\0';
    *(char *)((long)in_RAX + 0x53) = '\0';
  }
  return (VmaAllocation_T *)in_RAX;
}

Assistant:

T* VmaPoolAllocator<T>::Alloc(Types&&... args)
{
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];
        // This block has some free items: Use first one.
        if (block.FirstFreeIndex != UINT32_MAX)
        {
            Item* const pItem = &block.pItems[block.FirstFreeIndex];
            block.FirstFreeIndex = pItem->NextFreeIndex;
            T* result = (T*)&pItem->Value;
            new(result)T(std::forward<Types>(args)...); // Explicit constructor call.
            return result;
        }
    }

    // No block has free item: Create new one and use it.
    ItemBlock& newBlock = CreateNewBlock();
    Item* const pItem = &newBlock.pItems[0];
    newBlock.FirstFreeIndex = pItem->NextFreeIndex;
    T* result = (T*)&pItem->Value;
    new(result) T(std::forward<Types>(args)...); // Explicit constructor call.
    return result;
}